

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O1

Abc_Ntk_t * Io_ReadBench(char *pFileName,int fCheck)

{
  char cVar1;
  uint uVar2;
  undefined8 *puVar3;
  bool bVar4;
  FILE *pFile;
  int iVar5;
  int iVar6;
  uint uVar7;
  Extra_FileReader_t *p;
  char *pcVar8;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *p_00;
  ProgressBar *p_01;
  void *pvVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  Mem_Flex_t *pMVar16;
  size_t __size;
  char **pNamesIn;
  ulong uVar17;
  uint uTruth [8];
  uint local_438 [8];
  char local_418 [1000];
  
  p = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t,()=");
  if (p == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pcVar8 = Extra_FileReaderGetFileName(p);
  pNtk = Abc_NtkStartRead(pcVar8);
  pNtk->nConstrs = 0;
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pcVar8 = (char *)malloc(100);
  p_00->pArray = pcVar8;
  pFile = _stdout;
  iVar5 = Extra_FileReaderGetFileSize(p);
  p_01 = Extra_ProgressBarStart(pFile,iVar5);
  pvVar9 = Extra_FileReaderGetTokens(p);
  if (pvVar9 != (void *)0x0) {
    bVar4 = false;
LAB_00329fc2:
    iVar5 = Extra_FileReaderGetCurPosition(p);
    if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar5)) {
      Extra_ProgressBarUpdate_int(p_01,iVar5,(char *)0x0);
    }
    iVar5 = *(int *)((long)pvVar9 + 4);
    if (iVar5 == 1) {
      pcVar8 = Extra_FileReaderGetFileName(p);
      printf("%s: Wrong input file format.\n",pcVar8);
LAB_0032a86b:
      if (p_00->pArray != (char *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (char *)0x0;
      }
      free(p_00);
    }
    else {
      puVar3 = *(undefined8 **)((long)pvVar9 + 8);
      pcVar8 = (char *)*puVar3;
      iVar6 = strncmp(pcVar8,"INPUT",5);
      if (iVar6 == 0) {
        Io_ReadCreatePi(pNtk,(char *)puVar3[1]);
        goto LAB_0032a7f4;
      }
      iVar6 = strncmp(pcVar8,"OUTPUT",5);
      pcVar13 = (char *)puVar3[1];
      if (iVar6 == 0) {
        Io_ReadCreatePo(pNtk,pcVar13);
        goto LAB_0032a7f4;
      }
      iVar6 = strncmp(pcVar13,"DFF",3);
      if (iVar6 == 0) {
        if (iVar5 == 6) {
          pcVar8 = (char *)**(undefined8 **)((long)pvVar9 + 8);
          pAVar10 = Abc_NtkFindOrCreateNet(pNtk,pcVar8);
          pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
          Abc_ObjAddFanin(pAVar10,pAVar11);
          if (2 < *(int *)((long)pvVar9 + 4)) {
            lVar14 = 2;
            do {
              pcVar13 = *(char **)(*(long *)((long)pvVar9 + 8) + lVar14 * 8);
              sprintf(local_418,"%s_%s",pcVar8,pcVar13);
              pAVar10 = Abc_NtkFindOrCreateNet(pNtk,pcVar13);
              pAVar10 = Abc_NtkCreateNodeBuf(pNtk,pAVar10);
              pAVar11 = Abc_NtkFindOrCreateNet(pNtk,local_418);
              Abc_ObjAddFanin(pAVar11,pAVar10);
              pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
              Abc_ObjAddFanin(pAVar10,pAVar11);
              lVar14 = lVar14 + 1;
            } while (lVar14 < *(int *)((long)pvVar9 + 4));
          }
          pNtk->nConstrs = pNtk->nConstrs + 1;
        }
        else {
          pAVar10 = Io_ReadCreateLatch(pNtk,(char *)puVar3[2],pcVar8);
          uVar7 = *(uint *)&pAVar10->field_0x14 & 0xf;
          if (pcVar13[3] == '1') {
            if (uVar7 != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
            }
            pAVar10->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
          }
          else if (pcVar13[3] == '0') {
            if (uVar7 != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            pAVar10->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          }
          else {
            if (uVar7 != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
            }
            pAVar10->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
          }
        }
        goto LAB_0032a7f4;
      }
      iVar6 = strcmp(pcVar13,"LUT");
      if (iVar6 != 0) {
        iVar5 = iVar5 + -2;
        pAVar10 = Io_ReadCreateNode(pNtk,pcVar8,(char **)(puVar3 + 2),iVar5);
        iVar6 = strcmp(pcVar13,"AND");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"and"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
LAB_0032a7e6:
          (pAVar10->field_5).pData = pcVar8;
          goto LAB_0032a7f4;
        }
        iVar6 = strcmp(pcVar13,"OR");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"or"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateOr((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
          goto LAB_0032a7e6;
        }
        iVar6 = strcmp(pcVar13,"NAND");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"nand"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateNand((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032a7e6;
        }
        iVar6 = strcmp(pcVar13,"NOR");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"nor"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateNor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032a7e6;
        }
        iVar6 = strcmp(pcVar13,"XOR");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"xor"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateXor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032a7e6;
        }
        iVar6 = strcmp(pcVar13,"NXOR");
        if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar13,"XNOR"), iVar6 == 0)) ||
            (iVar6 = strcmp(pcVar13,"nxor"), iVar6 == 0)) ||
           (iVar6 = strcmp(pcVar13,"xnor"), iVar6 == 0)) {
          pcVar8 = Abc_SopCreateNxor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032a7e6;
        }
        iVar5 = strncmp(pcVar13,"BUF",3);
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar13,"buf"), iVar5 == 0)) {
          pcVar8 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
          goto LAB_0032a7e6;
        }
        iVar5 = strcmp(pcVar13,"NOT");
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar13,"not"), iVar5 == 0)) {
          pcVar8 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
          goto LAB_0032a7e6;
        }
        iVar5 = strncmp(pcVar13,"MUX",3);
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar13,"mux"), iVar5 == 0)) {
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = "0-1 1\n11- 1\n";
LAB_0032a837:
          pcVar8 = Abc_SopRegister(pMVar16,pcVar8);
          goto LAB_0032a7e6;
        }
        iVar5 = strncmp(pcVar13,"gnd",3);
        if (iVar5 == 0) {
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = " 0\n";
          goto LAB_0032a837;
        }
        iVar5 = strncmp(pcVar13,"vdd",3);
        if (iVar5 == 0) {
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = " 1\n";
          goto LAB_0032a837;
        }
        uVar7 = Extra_FileReaderGetLineNumber(p,0);
        printf("Io_ReadBenchNetwork(): Cannot determine gate type \"%s\" in line %d.\n",pcVar13,
               (ulong)uVar7);
        goto LAB_0032aae4;
      }
      uVar7 = iVar5 - 3;
      if (0xb < iVar5) {
        pcVar8 = Extra_FileReaderGetFileName(p);
        printf("%s: Currently cannot read truth tables with more than 8 inputs (%d).\n",pcVar8,
               (ulong)uVar7);
        goto LAB_0032a86b;
      }
      pcVar8 = (char *)puVar3[2];
      iVar6 = strncmp(pcVar8,"0x",2);
      if (iVar6 == 0) {
        pcVar8 = pcVar8 + 2;
        uVar2 = (uint)(1 << ((byte)uVar7 & 0x1f)) >> 2;
        if (uVar7 < 2) {
          uVar2 = 1;
        }
        sVar12 = strlen(pcVar8);
        if (sVar12 < uVar2) {
          iVar6 = uVar2 - (int)sVar12;
          if (p_00->nCap < iVar6) {
            if (p_00->pArray == (char *)0x0) {
              pcVar13 = (char *)malloc((long)iVar6);
            }
            else {
              pcVar13 = (char *)realloc(p_00->pArray,(long)iVar6);
            }
            p_00->pArray = pcVar13;
            p_00->nCap = iVar6;
          }
          p_00->nSize = iVar6;
          if (0 < iVar6) {
            lVar14 = 0;
            do {
              p_00->pArray[lVar14] = '0';
              lVar14 = lVar14 + 1;
            } while (lVar14 < p_00->nSize);
          }
          sVar12 = strlen(pcVar8);
          if (0 < (int)(uint)sVar12) {
            uVar17 = 0;
            do {
              cVar1 = pcVar8[uVar17];
              uVar2 = p_00->nCap;
              if (p_00->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (p_00->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(p_00->pArray,0x10);
                  }
                  __size = 0x10;
                }
                else {
                  __size = (ulong)uVar2 * 2;
                  if ((int)__size <= (int)uVar2) goto LAB_0032a5ba;
                  if (p_00->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(__size);
                  }
                  else {
                    pcVar13 = (char *)realloc(p_00->pArray,__size);
                  }
                }
                p_00->pArray = pcVar13;
                p_00->nCap = (int)__size;
              }
LAB_0032a5ba:
              iVar6 = p_00->nSize;
              p_00->nSize = iVar6 + 1;
              p_00->pArray[iVar6] = cVar1;
              uVar17 = uVar17 + 1;
            } while (((uint)sVar12 & 0x7fffffff) != uVar17);
          }
          uVar2 = p_00->nCap;
          if (p_00->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(p_00->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar2 * 2;
              if ((int)sVar12 <= (int)uVar2) goto LAB_0032a657;
              if (p_00->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar12);
              }
              else {
                pcVar8 = (char *)realloc(p_00->pArray,sVar12);
              }
            }
            p_00->pArray = pcVar8;
            p_00->nCap = (int)sVar12;
          }
LAB_0032a657:
          iVar6 = p_00->nSize;
          p_00->nSize = iVar6 + 1;
          p_00->pArray[iVar6] = '\0';
          pcVar8 = p_00->pArray;
        }
        iVar6 = Extra_ReadHexadecimal(local_438,pcVar8,uVar7);
        if (iVar6 != 0) {
          pNamesIn = (char **)(puVar3 + 3);
          uVar17 = (ulong)(uint)(1 << ((char)iVar5 - 8U & 0x1f));
          uVar15 = uVar17;
          if (iVar5 < 9) {
            uVar17 = 1;
            uVar15 = uVar17;
          }
          do {
            if ((long)uVar17 < 1) {
              pAVar10 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar9 + 8),pNamesIn,
                                          0);
              pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
              pcVar8 = " 0\n";
              goto LAB_0032a777;
            }
            lVar14 = uVar17 - 1;
            uVar17 = uVar17 - 1;
          } while (local_438[lVar14] == 0);
LAB_0032a6b2:
          if (0 < (long)uVar15) goto code_r0x0032a6bb;
          pAVar10 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar9 + 8),pNamesIn,0);
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = " 1\n";
LAB_0032a777:
          pcVar8 = Abc_SopRegister(pMVar16,pcVar8);
          (pAVar10->field_5).pData = pcVar8;
          bVar4 = true;
          goto LAB_0032a7f4;
        }
        pcVar13 = Extra_FileReaderGetFileName(p);
        printf("%s: Reading hexadecimal number (%s) has failed.\n",pcVar13,pcVar8);
        goto LAB_0032a86b;
      }
      pcVar13 = Extra_FileReaderGetFileName(p);
      printf("%s: The LUT signature (%s) does not look like a hexadecimal beginning with \"0x\".\n",
             pcVar13,pcVar8);
      if (p_00->pArray != (char *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (char *)0x0;
      }
      free(p_00);
    }
    goto LAB_0032a9dd;
  }
  bVar4 = true;
LAB_0032a8a0:
  Extra_ProgressBarStop(p_01);
  if (p_00->pArray != (char *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (char *)0x0;
  }
  free(p_00);
  pAVar10 = Abc_NtkFindNet(pNtk,"gnd");
  if ((pAVar10 != (Abc_Obj_t *)0x0) && ((pAVar10->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"gnd",0);
  }
  pAVar10 = Abc_NtkFindNet(pNtk,"1");
  if ((pAVar10 != (Abc_Obj_t *)0x0) && ((pAVar10->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 0 fanin to non-driven net \"1\".");
    Io_ReadCreateConst(pNtk,"1",0);
  }
  pAVar10 = Abc_NtkFindNet(pNtk,"vdd");
  if ((pAVar10 != (Abc_Obj_t *)0x0) && ((pAVar10->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"vdd",1);
  }
  pAVar10 = Abc_NtkFindNet(pNtk,"2");
  if ((pAVar10 != (Abc_Obj_t *)0x0) && ((pAVar10->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 1 fanin to non-driven net \"2\".");
    Io_ReadCreateConst(pNtk,"2",1);
  }
  Abc_NtkFinalizeRead(pNtk);
  if (!bVar4) {
    iVar5 = Abc_NtkToBdd(pNtk);
    if (iVar5 == 0) {
      pcVar8 = "Io_ReadBenchNetwork(): Converting to BDD has failed.";
    }
    else {
      iVar5 = Abc_NtkToSop(pNtk,-1,1000000000);
      if (iVar5 != 0) goto LAB_0032a9e8;
      pcVar8 = "Io_ReadBenchNetwork(): Converting to SOP has failed.";
    }
    puts(pcVar8);
LAB_0032a9dd:
    Abc_NtkDelete(pNtk);
    pNtk = (Abc_Ntk_t *)0x0;
  }
LAB_0032a9e8:
  Extra_FileReaderFree(p);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (fCheck == 0) {
      return pNtk;
    }
    iVar5 = Abc_NtkCheckRead(pNtk);
    if (iVar5 != 0) {
      return pNtk;
    }
    puts("Io_ReadBench: The network check has failed.");
    Abc_NtkDelete(pNtk);
  }
  return (Abc_Ntk_t *)0x0;
code_r0x0032a6bb:
  lVar14 = uVar15 - 1;
  uVar15 = uVar15 - 1;
  if (local_438[lVar14] != 0xffffffff) goto code_r0x0032a6c6;
  goto LAB_0032a6b2;
code_r0x0032a6c6:
  pAVar10 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar9 + 8),pNamesIn,uVar7);
  if (iVar5 < 4) {
    __assert_fail("nNames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBench.c"
                  ,0xd7,"Abc_Ntk_t *Io_ReadBenchNetwork(Extra_FileReader_t *)");
  }
  if (iVar5 == 4) {
    if (*pcVar8 == '1') {
      pcVar8 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
    }
    else {
      if (*pcVar8 != '2') {
        pcVar13 = Extra_FileReaderGetFileName(p);
        printf("%s: Reading truth table (%s) of single-input node has failed.\n",pcVar13,pcVar8);
LAB_0032aae4:
        Vec_StrFree(p_00);
        goto LAB_0032a9dd;
      }
      pcVar8 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
    }
  }
  else {
    pcVar8 = Abc_SopCreateFromTruth((Mem_Flex_t *)pNtk->pManFunc,uVar7,local_438);
  }
  (pAVar10->field_5).pData = pcVar8;
  bVar4 = true;
LAB_0032a7f4:
  pvVar9 = Extra_FileReaderGetTokens(p);
  if (pvVar9 == (void *)0x0) goto LAB_0032a898;
  goto LAB_00329fc2;
LAB_0032a898:
  bVar4 = !bVar4;
  goto LAB_0032a8a0;
}

Assistant:

Abc_Ntk_t * Io_ReadBench( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t,()=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadBenchNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBench: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}